

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3StringAppend(StrBuffer *pStr,char *zAppend,int nAppend)

{
  char *pOld;
  int iVar1;
  size_t sVar2;
  char *nBytes;
  long lVar3;
  uint uVar4;
  
  if (nAppend < 0) {
    sVar2 = strlen(zAppend);
    nAppend = (int)sVar2;
  }
  if (pStr->nAlloc <= pStr->n + nAppend + 1) {
    uVar4 = nAppend + pStr->nAlloc + 100;
    pOld = pStr->z;
    iVar1 = sqlite3_initialize();
    nBytes = (char *)0x0;
    if (iVar1 == 0) {
      if (0 < (int)uVar4) {
        nBytes = (char *)(ulong)uVar4;
      }
      nBytes = (char *)sqlite3Realloc(pOld,(u64)nBytes);
    }
    if (nBytes == (char *)0x0) {
      return 7;
    }
    pStr->z = nBytes;
    pStr->nAlloc = uVar4;
  }
  memcpy(pStr->z + pStr->n,zAppend,(long)nAppend);
  lVar3 = (long)pStr->n + (long)nAppend;
  pStr->n = (int)lVar3;
  pStr->z[lVar3] = '\0';
  return 0;
}

Assistant:

static int fts3StringAppend(
  StrBuffer *pStr,                /* Buffer to append to */
  const char *zAppend,            /* Pointer to data to append to buffer */
  int nAppend                     /* Size of zAppend in bytes (or -1) */
){
  if( nAppend<0 ){
    nAppend = (int)strlen(zAppend);
  }

  /* If there is insufficient space allocated at StrBuffer.z, use realloc()
  ** to grow the buffer until so that it is big enough to accomadate the
  ** appended data.
  */
  if( pStr->n+nAppend+1>=pStr->nAlloc ){
    int nAlloc = pStr->nAlloc+nAppend+100;
    char *zNew = sqlite3_realloc(pStr->z, nAlloc);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pStr->z = zNew;
    pStr->nAlloc = nAlloc;
  }
  assert( pStr->z!=0 && (pStr->nAlloc >= pStr->n+nAppend+1) );

  /* Append the data to the string buffer. */
  memcpy(&pStr->z[pStr->n], zAppend, nAppend);
  pStr->n += nAppend;
  pStr->z[pStr->n] = '\0';

  return SQLITE_OK;
}